

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O0

int picklock(void)

{
  boolean bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char local_e;
  char local_d;
  int local_c;
  xchar y;
  xchar x;
  
  if (xlock.box == (obj *)0x0) {
    if (xlock.door !=
        level->locations[(int)u.ux + (int)picklock_dx] + ((int)u.uy + (int)picklock_dy)) {
      xlock.usedtime = 0;
      return 0;
    }
    uVar3 = *(uint *)&(xlock.door)->field_0x6 >> 4 & 0x1f;
    if (uVar3 == 0) {
      pline("This doorway has no door.");
      xlock.usedtime = 0;
      return 0;
    }
    if (uVar3 == 1) {
      pline("This door is broken.");
      xlock.usedtime = 0;
      return 0;
    }
    if (uVar3 == 2) {
      pline("You cannot lock an open door.");
      xlock.usedtime = 0;
      return 0;
    }
  }
  else if (((xlock.box)->ox != u.ux) || ((xlock.box)->oy != u.uy)) {
    if ((xlock.box)->otyp == 0xdc) {
      iVar2 = (int)(xlock.box)->oy - (int)u.uy;
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      if (iVar2 < 2) {
        iVar2 = (int)(xlock.box)->ox - (int)u.ux;
        if (iVar2 < 1) {
          iVar2 = -iVar2;
        }
        if (iVar2 < 2) goto LAB_001fd754;
      }
    }
    xlock.usedtime = 0;
    return 0;
  }
LAB_001fd754:
  if ((xlock.usedtime < 0x32) && (((youmonst.data)->mflags1 & 0x2000) == 0)) {
    xlock.usedtime = xlock.usedtime + 1;
    iVar2 = rn2(100);
    if (iVar2 < xlock.chance) {
      lock_action();
      pline("You succeed in %s.");
      if (xlock.door == (rm *)0x0) {
        *(uint *)&(xlock.box)->field_0x4a =
             *(uint *)&(xlock.box)->field_0x4a & 0xffffdfff |
             (uint)((*(uint *)&(xlock.box)->field_0x4a >> 0xd & 1) == 0) << 0xd;
        if ((*(uint *)&(xlock.box)->field_0x4a >> 0xf & 1) == 0) {
          if (((*(uint *)&(xlock.box)->field_0x4a >> 0xd & 1) == 0) && (xlock.loot_unlocked != '\0')
             ) {
            use_container(xlock.box,0);
          }
        }
        else {
          chest_trap(xlock.box,3,'\0');
        }
      }
      else {
        if ((*(uint *)&(xlock.door)->field_0x6 >> 4 & 0x10) == 0) {
          if ((*(uint *)&(xlock.door)->field_0x6 >> 4 & 8) == 0) {
            *(uint *)&(xlock.door)->field_0x6 =
                 *(uint *)&(xlock.door)->field_0x6 & 0xfffffe0f | 0x80;
          }
          else {
            *(uint *)&(xlock.door)->field_0x6 =
                 *(uint *)&(xlock.door)->field_0x6 & 0xfffffe0f | 0x40;
          }
        }
        else {
          b_trapped("door",3);
          *(uint *)&(xlock.door)->field_0x6 = *(uint *)&(xlock.door)->field_0x6 & 0xfffffe0f;
          unblock_point((int)u.ux + (int)picklock_dx,(int)u.uy + (int)picklock_dy);
          pcVar4 = in_rooms(level,u.ux + picklock_dx,u.uy + picklock_dy,0x12);
          if (*pcVar4 != '\0') {
            add_damage(u.ux + picklock_dx,u.uy + picklock_dy,0);
          }
          newsym((int)u.ux + (int)picklock_dx,(int)u.uy + (int)picklock_dy);
        }
        for (local_d = '\x01'; local_d < 'P'; local_d = local_d + '\x01') {
          for (local_e = '\0'; local_e < '\x15'; local_e = local_e + '\x01') {
            bVar1 = picking_at((int)local_d,(int)local_e);
            if (bVar1 != '\0') {
              magic_map_background(local_d,local_e,1);
            }
          }
        }
      }
      exercise(3,'\x01');
      xlock.usedtime = 0;
      local_c = 0;
    }
    else {
      local_c = 1;
    }
  }
  else {
    xlock.usedtime = xlock.usedtime + 1;
    pcVar4 = lock_action();
    pline("You give up your attempt at %s.",pcVar4);
    exercise(3,'\x01');
    xlock.usedtime = 0;
    local_c = 0;
  }
  return local_c;
}

Assistant:

static int picklock(void)
{
	xchar x, y;
	if (xlock.box) {
	    if (((xlock.box->ox != u.ux) || (xlock.box->oy != u.uy)) &&
		    (xlock.box->otyp != IRON_SAFE || abs(xlock.box->oy - u.uy) > 1 ||
		     abs(xlock.box->ox - u.ux) > 1)) {
		return (xlock.usedtime = 0);		/* you or it moved */
	    }
	} else {		/* door */
	    if (xlock.door != &(level->locations[u.ux+picklock_dx][u.uy+picklock_dy])) {
		return (xlock.usedtime = 0);		/* you moved */
	    }
	    switch (xlock.door->doormask) {
		case D_NODOOR:
		    pline("This doorway has no door.");
		    return (xlock.usedtime = 0);
		case D_ISOPEN:
		    pline("You cannot lock an open door.");
		    return (xlock.usedtime = 0);
		case D_BROKEN:
		    pline("This door is broken.");
		    return (xlock.usedtime = 0);
	    }
	}

	if (xlock.usedtime++ >= 50 || nohands(youmonst.data)) {
	    pline("You give up your attempt at %s.", lock_action());
	    exercise(A_DEX, TRUE);	/* even if you don't succeed */
	    return (xlock.usedtime = 0);
	}

	if (rn2(100) >= xlock.chance) return 1;		/* still busy */

	pline("You succeed in %s.", lock_action());
	if (xlock.door) {
	    if (xlock.door->doormask & D_TRAPPED) {
		    b_trapped("door", FINGER);
		    xlock.door->doormask = D_NODOOR;
		    unblock_point(u.ux+picklock_dx, u.uy+picklock_dy);
		    if (*in_rooms(level, u.ux+picklock_dx, u.uy+picklock_dy, SHOPBASE))
			add_damage(u.ux+picklock_dx, u.uy+picklock_dy, 0L);
		    newsym(u.ux+picklock_dx, u.uy+picklock_dy);
	    } else if (xlock.door->doormask & D_LOCKED)
		xlock.door->doormask = D_CLOSED;
	    else xlock.door->doormask = D_LOCKED;
	    /*
	     * Player now knows the door's open/closed status, and its
	     * locked/unlocked status, and also that it isn't trapped
	     * (it would have exploded otherwise); we haven't recorded
	     * the location of the door being picked, so scan for it.
	     */
	    for (x = 1; x < COLNO; x++) {
		for (y = 0; y < ROWNO; y++) {
		    if (picking_at(x, y))
			magic_map_background(x, y, TRUE);
		}
	    }
	} else {
	    xlock.box->olocked = !xlock.box->olocked;
	    if (xlock.box->otrapped)
		chest_trap(xlock.box, FINGER, FALSE);
	    else if (!xlock.box->olocked && xlock.loot_unlocked)
		use_container(xlock.box, 0);
	}
	exercise(A_DEX, TRUE);
	return (xlock.usedtime = 0);
}